

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_enumerate_devices__jack
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  ma_bool32 mVar1;
  ma_device_info deviceInfo;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x50bd,
                  "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback != (ma_enum_devices_callback_proc)0x0) {
    memset(&deviceInfo,0,0x230);
    ma_strncpy_s(deviceInfo.name,0x100,"Default Playback Device",0xffffffffffffffff);
    mVar1 = (*callback)(pContext,ma_device_type_playback,&deviceInfo,pUserData);
    if (mVar1 != 0) {
      memset(&deviceInfo,0,0x230);
      ma_strncpy_s(deviceInfo.name,0x100,"Default Capture Device",0xffffffffffffffff);
      (*callback)(pContext,ma_device_type_capture,&deviceInfo,pUserData);
    }
    return 0;
  }
  __assert_fail("callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x50be,
                "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
               );
}

Assistant:

static ma_result ma_context_enumerate_devices__jack(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    return MA_SUCCESS;
}